

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_protocol_handle_send_fragment
              (ENetHost *host,ENetPeer *peer,ENetProtocol *command,enet_uint8 **currentData)

{
  uint16_t uVar1;
  undefined1 local_a0 [8];
  ENetProtocol hostCommand;
  ENetIncomingCommand *incomingCommand;
  ENetIncomingCommand *startCommand;
  ENetListIterator currentCommand;
  enet_uint16 currentWindow;
  ENetChannel *pEStack_50;
  enet_uint16 startWindow;
  ENetChannel *channel;
  enet_uint32 totalLength;
  enet_uint32 startSequenceNumber;
  enet_uint32 fragmentLength;
  enet_uint32 fragmentOffset;
  enet_uint32 fragmentCount;
  enet_uint32 fragmentNumber;
  enet_uint8 **currentData_local;
  ENetProtocol *command_local;
  ENetPeer *peer_local;
  ENetHost *host_local;
  
  incomingCommand = (ENetIncomingCommand *)0x0;
  if (((ulong)(command->header).channelID < peer->channelCount) &&
     ((peer->state == ENET_PEER_STATE_CONNECTED || (peer->state == ENET_PEER_STATE_DISCONNECT_LATER)
      ))) {
    _fragmentCount = currentData;
    currentData_local = (enet_uint8 **)command;
    command_local = (ENetProtocol *)peer;
    peer_local = (ENetPeer *)host;
    uVar1 = ntohs((command->acknowledge).receivedSentTime);
    totalLength = (enet_uint32)uVar1;
    *_fragmentCount = *_fragmentCount + totalLength;
    if ((((totalLength == 0) ||
         (*(ulong *)(peer_local[0x15].unsequencedWindow + 0x16) < (ulong)totalLength)) ||
        (*_fragmentCount < *(enet_uint8 **)(peer_local[0x15].unsequencedWindow + 6))) ||
       ((enet_uint8 *)
        (*(long *)(peer_local[0x15].unsequencedWindow + 6) +
        *(long *)(peer_local[0x15].unsequencedWindow + 8)) < *_fragmentCount)) {
      host_local._4_4_ = -1;
    }
    else {
      pEStack_50 = (ENetChannel *)
                   (*(long *)((long)command_local + 0x48) +
                   (ulong)*(byte *)((long)currentData_local + 1) * 0x50);
      uVar1 = ntohs(*(uint16_t *)((long)currentData_local + 4));
      channel._4_4_ = (uint)uVar1;
      currentCommand._6_2_ = uVar1 >> 0xc;
      currentCommand._4_2_ = pEStack_50->incomingReliableSequenceNumber / 0x1000;
      if (channel._4_4_ < pEStack_50->incomingReliableSequenceNumber) {
        currentCommand._6_2_ = currentCommand._6_2_ + 0x10;
      }
      if ((currentCommand._6_2_ < currentCommand._4_2_) ||
         ((ushort)(currentCommand._4_2_ + 7) <= currentCommand._6_2_)) {
        host_local._4_4_ = 0;
      }
      else {
        fragmentOffset = ntohl(*(uint32_t *)((long)currentData_local + 0xc));
        fragmentLength = ntohl(*(uint32_t *)(currentData_local + 1));
        startSequenceNumber = ntohl(*(uint32_t *)((long)currentData_local + 0x14));
        channel._0_4_ = ntohl(*(uint32_t *)(currentData_local + 2));
        if (((fragmentLength < 0x100001) && (fragmentOffset < fragmentLength)) &&
           (((ulong)(uint32_t)channel <= *(ulong *)(peer_local[0x15].unsequencedWindow + 0x16) &&
            (((fragmentLength <= (uint32_t)channel && (startSequenceNumber < (uint32_t)channel)) &&
             (totalLength <= (uint32_t)channel - startSequenceNumber)))))) {
          for (startCommand = (ENetIncomingCommand *)
                              (pEStack_50->incomingReliableCommands).sentinel.previous;
              startCommand != (ENetIncomingCommand *)&pEStack_50->incomingReliableCommands;
              startCommand = (ENetIncomingCommand *)(startCommand->incomingCommandList).previous) {
            hostCommand._40_8_ = startCommand;
            if (channel._4_4_ < pEStack_50->incomingReliableSequenceNumber) {
              if (pEStack_50->incomingReliableSequenceNumber <= startCommand->reliableSequenceNumber
                 ) break;
LAB_0010bdb0:
              if (startCommand->reliableSequenceNumber <= channel._4_4_) {
                if (channel._4_4_ <= startCommand->reliableSequenceNumber) {
                  if (((((startCommand->command).header.command & 0xf) != 8) ||
                      ((ulong)(uint32_t)channel != startCommand->packet->dataLength)) ||
                     (fragmentLength != startCommand->fragmentCount)) {
                    return -1;
                  }
                  incomingCommand = startCommand;
                }
                break;
              }
            }
            else if (pEStack_50->incomingReliableSequenceNumber <=
                     startCommand->reliableSequenceNumber) goto LAB_0010bdb0;
          }
          if (incomingCommand == (ENetIncomingCommand *)0x0) {
            memcpy(local_a0,currentData_local,0x30);
            local_a0._2_2_ = (undefined2)channel._4_4_;
            incomingCommand =
                 enet_peer_queue_incoming_command
                           ((ENetPeer *)&command_local->header,(ENetProtocol *)local_a0,(void *)0x0,
                            (ulong)(uint32_t)channel,1,fragmentLength);
            if (incomingCommand == (ENetIncomingCommand *)0x0) {
              return -1;
            }
          }
          if ((incomingCommand->fragments[fragmentOffset >> 5] & 1 << ((byte)fragmentOffset & 0x1f))
              == 0) {
            incomingCommand->fragmentsRemaining = incomingCommand->fragmentsRemaining - 1;
            incomingCommand->fragments[fragmentOffset >> 5] =
                 1 << ((byte)fragmentOffset & 0x1f) |
                 incomingCommand->fragments[fragmentOffset >> 5];
            if (incomingCommand->packet->dataLength < (ulong)(startSequenceNumber + totalLength)) {
              totalLength = (int)incomingCommand->packet->dataLength - startSequenceNumber;
            }
            memcpy(incomingCommand->packet->data + startSequenceNumber,currentData_local + 3,
                   (ulong)totalLength);
            if (incomingCommand->fragmentsRemaining == 0) {
              enet_peer_dispatch_incoming_reliable_commands
                        ((ENetPeer *)&command_local->header,pEStack_50,(ENetIncomingCommand *)0x0);
            }
          }
          host_local._4_4_ = 0;
        }
        else {
          host_local._4_4_ = -1;
        }
      }
    }
  }
  else {
    host_local._4_4_ = -1;
  }
  return host_local._4_4_;
}

Assistant:

static int enet_protocol_handle_send_fragment(ENetHost *host, ENetPeer *peer, const ENetProtocol *command, enet_uint8 **currentData) {
        enet_uint32 fragmentNumber, fragmentCount, fragmentOffset, fragmentLength, startSequenceNumber, totalLength;
        ENetChannel *channel;
        enet_uint16 startWindow, currentWindow;
        ENetListIterator currentCommand;
        ENetIncomingCommand *startCommand = NULL;

        if (command->header.channelID >= peer->channelCount || (peer->state != ENET_PEER_STATE_CONNECTED && peer->state != ENET_PEER_STATE_DISCONNECT_LATER)) {
            return -1;
        }

        fragmentLength = ENET_NET_TO_HOST_16(command->sendFragment.dataLength);
        *currentData  += fragmentLength;
        if (fragmentLength <= 0 ||
            fragmentLength > host->maximumPacketSize ||
            *currentData < host->receivedData ||
            *currentData > &host->receivedData[host->receivedDataLength]
        ) {
            return -1;
        }

        channel = &peer->channels[command->header.channelID];
        startSequenceNumber = ENET_NET_TO_HOST_16(command->sendFragment.startSequenceNumber);
        startWindow         = startSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
        currentWindow       = channel->incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

        if (startSequenceNumber < channel->incomingReliableSequenceNumber) {
            startWindow += ENET_PEER_RELIABLE_WINDOWS;
        }

        if (startWindow < currentWindow || startWindow >= currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1) {
            return 0;
        }

        fragmentNumber = ENET_NET_TO_HOST_32(command->sendFragment.fragmentNumber);
        fragmentCount  = ENET_NET_TO_HOST_32(command->sendFragment.fragmentCount);
        fragmentOffset = ENET_NET_TO_HOST_32(command->sendFragment.fragmentOffset);
        totalLength    = ENET_NET_TO_HOST_32(command->sendFragment.totalLength);

        if (fragmentCount > ENET_PROTOCOL_MAXIMUM_FRAGMENT_COUNT ||
            fragmentNumber >= fragmentCount ||
            totalLength > host->maximumPacketSize ||
            totalLength < fragmentCount ||
            fragmentOffset >= totalLength ||
            fragmentLength > totalLength - fragmentOffset
        ) {
            return -1;
        }

        for (currentCommand = enet_list_previous(enet_list_end(&channel->incomingReliableCommands));
            currentCommand != enet_list_end(&channel->incomingReliableCommands);
            currentCommand = enet_list_previous(currentCommand)
        ) {
            ENetIncomingCommand *incomingCommand = (ENetIncomingCommand *) currentCommand;

            if (startSequenceNumber >= channel->incomingReliableSequenceNumber) {
                if (incomingCommand->reliableSequenceNumber < channel->incomingReliableSequenceNumber) {
                    continue;
                }
            } else if (incomingCommand->reliableSequenceNumber >= channel->incomingReliableSequenceNumber) {
                break;
            }

            if (incomingCommand->reliableSequenceNumber <= startSequenceNumber) {
                if (incomingCommand->reliableSequenceNumber < startSequenceNumber) {
                    break;
                }

                if ((incomingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK) !=
                    ENET_PROTOCOL_COMMAND_SEND_FRAGMENT ||
                    totalLength != incomingCommand->packet->dataLength ||
                    fragmentCount != incomingCommand->fragmentCount
                ) {
                    return -1;
                }

                startCommand = incomingCommand;
                break;
            }
        }

        if (startCommand == NULL) {
            ENetProtocol hostCommand = *command;
            hostCommand.header.reliableSequenceNumber = startSequenceNumber;
            startCommand = enet_peer_queue_incoming_command(peer, &hostCommand, NULL, totalLength, ENET_PACKET_FLAG_RELIABLE, fragmentCount);
            if (startCommand == NULL) {
                return -1;
            }
        }

        if ((startCommand->fragments[fragmentNumber / 32] & (1u << (fragmentNumber % 32))) == 0) {
            --startCommand->fragmentsRemaining;
            startCommand->fragments[fragmentNumber / 32] |= (1u << (fragmentNumber % 32));

            if (fragmentOffset + fragmentLength > startCommand->packet->dataLength) {
                fragmentLength = startCommand->packet->dataLength - fragmentOffset;
            }

            memcpy(startCommand->packet->data + fragmentOffset, (enet_uint8 *) command + sizeof(ENetProtocolSendFragment), fragmentLength);

            if (startCommand->fragmentsRemaining <= 0) {
                enet_peer_dispatch_incoming_reliable_commands(peer, channel, NULL);
            }
        }

        return 0;
    }